

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_write_vec2_double(void *a,double *uv,uint32_t nr_of_uv_positions,trico_stream_type st)

{
  ssize_t sVar1;
  uint8_t *local_68;
  uint8_t *compressed_v;
  uint8_t *puStack_58;
  uint32_t nr_of_compressed_v_bytes;
  uint8_t *compressed_u;
  double *pdStack_48;
  uint32_t nr_of_compressed_u_bytes;
  double *v;
  double *u;
  void *pvStack_30;
  uint8_t header;
  trico_archive *arch;
  trico_stream_type st_local;
  uint32_t nr_of_uv_positions_local;
  double *uv_local;
  void *a_local;
  
  u._7_1_ = (undefined1)st;
  pvStack_30 = a;
  arch._0_4_ = st;
  arch._4_4_ = nr_of_uv_positions;
  _st_local = uv;
  uv_local = (double *)a;
  sVar1 = write((int)&u + 7,(void *)0x1,1);
  if ((int)sVar1 == 0) {
    a_local._4_4_ = 0;
  }
  else {
    sVar1 = write((int)&arch + 4,(void *)0x4,1);
    if ((int)sVar1 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      v = (double *)trico_malloc((ulong)arch._4_4_ << 3);
      pdStack_48 = (double *)trico_malloc((ulong)arch._4_4_ << 3);
      trico_transpose_uv_aos_to_soa_double_precision
                (&v,&stack0xffffffffffffffb8,_st_local,arch._4_4_);
      trico_compress_double_precision
                ((uint32_t *)((long)&compressed_u + 4),&stack0xffffffffffffffa8,v,arch._4_4_,0x14,
                 0x14);
      trico_free(v);
      sVar1 = write((int)&compressed_u + 4,(void *)0x4,1);
      if ((int)sVar1 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        sVar1 = write((int)puStack_58,(void *)0x1,(ulong)compressed_u._4_4_);
        if ((int)sVar1 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          trico_free(puStack_58);
          trico_compress_double_precision
                    ((uint32_t *)((long)&compressed_v + 4),&local_68,pdStack_48,arch._4_4_,0x14,0x14
                    );
          trico_free(pdStack_48);
          sVar1 = write((int)&compressed_v + 4,(void *)0x4,1);
          if ((int)sVar1 == 0) {
            a_local._4_4_ = 0;
          }
          else {
            sVar1 = write((int)local_68,(void *)0x1,(ulong)compressed_v._4_4_);
            if ((int)sVar1 == 0) {
              a_local._4_4_ = 0;
            }
            else {
              trico_free(local_68);
              a_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int trico_write_vec2_double(void* a, const double* uv, uint32_t nr_of_uv_positions, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)st;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_uv_positions, sizeof(uint32_t), 1, arch))
    return 0;

  double* u = (double*)trico_malloc(sizeof(double)*nr_of_uv_positions);
  double* v = (double*)trico_malloc(sizeof(double)*nr_of_uv_positions);
  trico_transpose_uv_aos_to_soa_double_precision(&u, &v, uv, nr_of_uv_positions);

  uint32_t nr_of_compressed_u_bytes;
  uint8_t* compressed_u;
  trico_compress_double_precision(&nr_of_compressed_u_bytes, &compressed_u, u, nr_of_uv_positions, 20, 20);

  trico_free(u);
  if (!write(&nr_of_compressed_u_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_u, 1, nr_of_compressed_u_bytes, arch))
    return 0;
  trico_free(compressed_u);

  uint32_t nr_of_compressed_v_bytes;
  uint8_t* compressed_v;
  trico_compress_double_precision(&nr_of_compressed_v_bytes, &compressed_v, v, nr_of_uv_positions, 20, 20);

  trico_free(v);
  if (!write(&nr_of_compressed_v_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_v, 1, nr_of_compressed_v_bytes, arch))
    return 0;
  trico_free(compressed_v);

  return 1;
  }